

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

time_t isodate17(uchar *v)

{
  int iVar1;
  byte *in_RDI;
  time_t t;
  int offset;
  tm_conflict tm;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  byte *local_10;
  time_t local_8;
  
  local_10 = in_RDI;
  memset(&local_48,0,0x38);
  local_34 = (*local_10 - 0x30) * 1000 + (local_10[1] - 0x30) * 100 + (local_10[2] - 0x30) * 10 +
             (uint)local_10[3] + -0x79c;
  local_38 = (local_10[4] - 0x30) * 10 + (local_10[5] - 0x30);
  local_3c = (local_10[6] - 0x30) * 10 + (local_10[7] - 0x30);
  local_40 = (local_10[8] - 0x30) * 10 + (local_10[9] - 0x30);
  local_44 = (local_10[10] - 0x30) * 10 + (local_10[0xb] - 0x30);
  local_48 = (local_10[0xc] - 0x30) * 10 + (local_10[0xd] - 0x30);
  iVar1 = (int)(char)local_10[0x10];
  if ((-0x30 < iVar1) && (iVar1 < 0x34)) {
    local_40 = local_40 - iVar1 / 4;
    local_44 = local_44 + (iVar1 % 4) * -0xf;
  }
  local_8 = time_from_tm((tm_conflict *)0x13a34f);
  if (local_8 == -1) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static time_t
isodate17(const unsigned char *v)
{
	struct tm tm;
	int offset;
	time_t t;

	memset(&tm, 0, sizeof(tm));
	tm.tm_year = (v[0] - '0') * 1000 + (v[1] - '0') * 100
	    + (v[2] - '0') * 10 + (v[3] - '0')
	    - 1900;
	tm.tm_mon = (v[4] - '0') * 10 + (v[5] - '0');
	tm.tm_mday = (v[6] - '0') * 10 + (v[7] - '0');
	tm.tm_hour = (v[8] - '0') * 10 + (v[9] - '0');
	tm.tm_min = (v[10] - '0') * 10 + (v[11] - '0');
	tm.tm_sec = (v[12] - '0') * 10 + (v[13] - '0');
	/* v[16] is the signed timezone offset, in 1/4-hour increments. */
	offset = ((const signed char *)v)[16];
	if (offset > -48 && offset < 52) {
		tm.tm_hour -= offset / 4;
		tm.tm_min -= (offset % 4) * 15;
	}
	t = time_from_tm(&tm);
	if (t == (time_t)-1)
		return ((time_t)0);
	return (t);
}